

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool wabt::anon_unknown_1::IsPlainInstr(TokenType token_type)

{
  switch(token_type) {
  case AtomicFence:
  case AtomicLoad:
  case AtomicNotify:
  case AtomicRmw:
  case AtomicRmwCmpxchg:
  case AtomicStore:
  case AtomicWait:
  case Binary:
  case Br:
  case BrIf:
  case BrTable:
  case Call:
  case CallIndirect:
  case CallRef:
  case Compare:
  case Const:
  case Convert:
  case DataDrop:
  case Drop:
  case ElemDrop:
  case GlobalGet:
  case GlobalSet:
  case Load:
  case LocalGet:
  case LocalSet:
  case LocalTee:
  case MemoryCopy:
  case MemoryFill:
  case MemoryGrow:
  case MemoryInit:
  case MemorySize:
  case Nop:
  case RefFunc:
  case RefIsNull:
  case RefNull:
  case Rethrow:
  case ReturnCallIndirect:
  case ReturnCall:
  case Return:
  case Select:
  case SimdLaneOp:
  case SimdLoadLane:
  case SimdStoreLane:
  case SimdShuffleOp:
  case Store:
  case TableCopy:
  case TableFill:
  case TableGet:
  case TableGrow:
  case TableInit:
  case TableSet:
  case TableSize:
  case Ternary:
  case Throw:
  case Unary:
  case Last_Opcode:
    return true;
  default:
    return false;
  }
}

Assistant:

bool IsPlainInstr(TokenType token_type) {
  switch (token_type) {
    case TokenType::Unreachable:
    case TokenType::Nop:
    case TokenType::Drop:
    case TokenType::Select:
    case TokenType::Br:
    case TokenType::BrIf:
    case TokenType::BrTable:
    case TokenType::Return:
    case TokenType::ReturnCall:
    case TokenType::ReturnCallIndirect:
    case TokenType::Call:
    case TokenType::CallIndirect:
    case TokenType::CallRef:
    case TokenType::LocalGet:
    case TokenType::LocalSet:
    case TokenType::LocalTee:
    case TokenType::GlobalGet:
    case TokenType::GlobalSet:
    case TokenType::Load:
    case TokenType::Store:
    case TokenType::Const:
    case TokenType::Unary:
    case TokenType::Binary:
    case TokenType::Compare:
    case TokenType::Convert:
    case TokenType::MemoryCopy:
    case TokenType::DataDrop:
    case TokenType::MemoryFill:
    case TokenType::MemoryGrow:
    case TokenType::MemoryInit:
    case TokenType::MemorySize:
    case TokenType::TableCopy:
    case TokenType::ElemDrop:
    case TokenType::TableInit:
    case TokenType::TableGet:
    case TokenType::TableSet:
    case TokenType::TableGrow:
    case TokenType::TableSize:
    case TokenType::TableFill:
    case TokenType::Throw:
    case TokenType::Rethrow:
    case TokenType::RefFunc:
    case TokenType::RefNull:
    case TokenType::RefIsNull:
    case TokenType::AtomicLoad:
    case TokenType::AtomicStore:
    case TokenType::AtomicRmw:
    case TokenType::AtomicRmwCmpxchg:
    case TokenType::AtomicNotify:
    case TokenType::AtomicFence:
    case TokenType::AtomicWait:
    case TokenType::Ternary:
    case TokenType::SimdLaneOp:
    case TokenType::SimdLoadLane:
    case TokenType::SimdStoreLane:
    case TokenType::SimdShuffleOp:
      return true;
    default:
      return false;
  }
}